

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_in_out_testing_v2.cpp
# Opt level: O3

void print_time(long micro)

{
  ostream *poVar1;
  long lVar2;
  double dVar3;
  
  dVar3 = log10((double)micro);
  lVar2 = (long)dVar3;
  pow(10.0,(double)lVar2);
  if (0 < lVar2) {
    do {
      std::ostream::_M_insert<long>((long)&std::cout);
      if (lVar2 * -0x5555555555555555 + 0x2aaaaaaaaaaaaaaaU < 0x5555555555555555) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
      }
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  poVar1 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,anon_var_dwarf_27b12,3);
  return;
}

Assistant:

void print_time(long micro) {
    long n = (long) log10(micro);
    long p = pow(10, n);
    for (int i = 0; i < n; ++i) {
        cout << micro / p;
        micro %= p;
        p /= 10;
        if ((n - i) % 3 == 0) cout << "'";
    }
    cout << micro << "\u00B5s";
}